

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * __thiscall Kvm::evalDefinition(Kvm *this,Value *v,Value *env)

{
  Value *pVVar1;
  Value *var;
  Kvm *this_00;
  Value *result;
  GcGuard guard;
  Value *local_38;
  GcGuard local_30;
  
  local_38 = (Value *)0x0;
  local_30.gc_ = &this->gc_;
  local_30.times_ = 0;
  GcGuard::pushLocalStackRoot(&local_30,&local_38);
  local_38 = definitionValue(this,v);
  this_00 = this;
  pVVar1 = eval(this,local_38,env);
  local_38 = pVVar1;
  if (pVVar1 == (Value *)0x0) {
    pVVar1 = (Value *)0x0;
  }
  else {
    var = definitionVariable(this_00,v);
    defineVariable(this,var,pVVar1,env);
    pVVar1 = this->OK;
  }
  GcGuard::~GcGuard(&local_30);
  return pVVar1;
}

Assistant:

const Value* Kvm::evalDefinition(const Value *v, const Value *env)
{
    const Value *result = nullptr;
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result);
    result = definitionValue(v);
    result = eval(result, env);
    if (!result) return nullptr;
    defineVariable(definitionVariable(v), result, env);
    return OK;
}